

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O3

int start_openssh_fixture(void)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = getenv("OPENSSH_NO_DOCKER");
  have_docker = (int)(pcVar2 == (char *)0x0);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = getenv("OPENSSH_SERVER_IMAGE");
    if (((pcVar2 == (char *)0x0) ||
        (iVar1 = run_command((char **)0x0,"docker pull %s",pcVar2), iVar1 != 0)) ||
       (iVar1 = run_command((char **)0x0,"docker tag %s libssh2/openssh_server",pcVar2), iVar1 != 0)
       ) {
      pcVar2 = srcdir_path("openssh_server");
      iVar1 = run_command((char **)0x0,"docker build --quiet -t libssh2/openssh_server %s",pcVar2);
      if (iVar1 != 0) {
        start_openssh_fixture_cold_1();
        return iVar1;
      }
    }
    if (have_docker != 0) {
      pcVar2 = getenv("OPENSSH_SERVER_PORT");
      if (pcVar2 == (char *)0x0) {
        iVar1 = run_command(&running_container_id,"docker run --rm -d -p 22 libssh2/openssh_server")
        ;
        return iVar1;
      }
      iVar1 = run_command(&running_container_id,"docker run --rm -d -p %s:22 libssh2/openssh_server"
                          ,pcVar2);
      return iVar1;
    }
  }
  running_container_id = strdup("");
  return 0;
}

Assistant:

int start_openssh_fixture(void)
{
    int ret;
#ifdef _WIN32
    WSADATA wsadata;

    ret = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(ret) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", ret);
        return 1;
    }
#endif

    have_docker = !getenv("OPENSSH_NO_DOCKER");

    ret = build_openssh_server_docker_image();
    if(!ret) {
        return start_openssh_server(&running_container_id);
    }
    else {
        fprintf(stderr, "Failed to build docker image\n");
        return ret;
    }
}